

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O0

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxRigidBody[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t *psVar3;
  PmxRigidBody *__p;
  ulong uVar4;
  PmxRigidBody *local_60;
  size_t n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0x88),0);
  uVar4 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x88),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  psVar3 = (size_t *)operator_new__(uVar4);
  *psVar3 = n;
  __p = (PmxRigidBody *)(psVar3 + 1);
  if (n != 0) {
    local_60 = __p;
    do {
      pmx::PmxRigidBody::PmxRigidBody(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != __p + n);
  }
  std::unique_ptr<pmx::PmxRigidBody[],std::default_delete<pmx::PmxRigidBody[]>>::
  unique_ptr<pmx::PmxRigidBody*,std::default_delete<pmx::PmxRigidBody[]>,void,bool>
            ((unique_ptr<pmx::PmxRigidBody[],std::default_delete<pmx::PmxRigidBody[]>> *)this,__p);
  return (__uniq_ptr_data<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>,_true,_true>)
         this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }